

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

bool __thiscall el::base::VRegistry::allowed(VRegistry *this,VerboseLevel vlevel,char *file)

{
  ushort uVar1;
  bool bVar2;
  __node_base *p_Var3;
  allocator local_b9;
  string local_b8;
  char baseFilename [100];
  
  (*(this->super_ThreadSafe)._vptr_ThreadSafe[2])();
  if ((file == (char *)0x0) || ((this->m_modules)._M_h._M_element_count == 0)) {
    uVar1 = *(ushort *)&(this->super_ThreadSafe).field_0xa;
  }
  else {
    baseFilename[0x50] = '\0';
    baseFilename[0x51] = '\0';
    baseFilename[0x52] = '\0';
    baseFilename[0x53] = '\0';
    baseFilename[0x54] = '\0';
    baseFilename[0x55] = '\0';
    baseFilename[0x56] = '\0';
    baseFilename[0x57] = '\0';
    baseFilename[0x58] = '\0';
    baseFilename[0x59] = '\0';
    baseFilename[0x5a] = '\0';
    baseFilename[0x5b] = '\0';
    baseFilename[0x5c] = '\0';
    baseFilename[0x5d] = '\0';
    baseFilename[0x5e] = '\0';
    baseFilename[0x5f] = '\0';
    baseFilename[0x40] = '\0';
    baseFilename[0x41] = '\0';
    baseFilename[0x42] = '\0';
    baseFilename[0x43] = '\0';
    baseFilename[0x44] = '\0';
    baseFilename[0x45] = '\0';
    baseFilename[0x46] = '\0';
    baseFilename[0x47] = '\0';
    baseFilename[0x48] = '\0';
    baseFilename[0x49] = '\0';
    baseFilename[0x4a] = '\0';
    baseFilename[0x4b] = '\0';
    baseFilename[0x4c] = '\0';
    baseFilename[0x4d] = '\0';
    baseFilename[0x4e] = '\0';
    baseFilename[0x4f] = '\0';
    baseFilename[0x30] = '\0';
    baseFilename[0x31] = '\0';
    baseFilename[0x32] = '\0';
    baseFilename[0x33] = '\0';
    baseFilename[0x34] = '\0';
    baseFilename[0x35] = '\0';
    baseFilename[0x36] = '\0';
    baseFilename[0x37] = '\0';
    baseFilename[0x38] = '\0';
    baseFilename[0x39] = '\0';
    baseFilename[0x3a] = '\0';
    baseFilename[0x3b] = '\0';
    baseFilename[0x3c] = '\0';
    baseFilename[0x3d] = '\0';
    baseFilename[0x3e] = '\0';
    baseFilename[0x3f] = '\0';
    baseFilename[0x20] = '\0';
    baseFilename[0x21] = '\0';
    baseFilename[0x22] = '\0';
    baseFilename[0x23] = '\0';
    baseFilename[0x24] = '\0';
    baseFilename[0x25] = '\0';
    baseFilename[0x26] = '\0';
    baseFilename[0x27] = '\0';
    baseFilename[0x28] = '\0';
    baseFilename[0x29] = '\0';
    baseFilename[0x2a] = '\0';
    baseFilename[0x2b] = '\0';
    baseFilename[0x2c] = '\0';
    baseFilename[0x2d] = '\0';
    baseFilename[0x2e] = '\0';
    baseFilename[0x2f] = '\0';
    baseFilename[0x10] = '\0';
    baseFilename[0x11] = '\0';
    baseFilename[0x12] = '\0';
    baseFilename[0x13] = '\0';
    baseFilename[0x14] = '\0';
    baseFilename[0x15] = '\0';
    baseFilename[0x16] = '\0';
    baseFilename[0x17] = '\0';
    baseFilename[0x18] = '\0';
    baseFilename[0x19] = '\0';
    baseFilename[0x1a] = '\0';
    baseFilename[0x1b] = '\0';
    baseFilename[0x1c] = '\0';
    baseFilename[0x1d] = '\0';
    baseFilename[0x1e] = '\0';
    baseFilename[0x1f] = '\0';
    baseFilename[0] = '\0';
    baseFilename[1] = '\0';
    baseFilename[2] = '\0';
    baseFilename[3] = '\0';
    baseFilename[4] = '\0';
    baseFilename[5] = '\0';
    baseFilename[6] = '\0';
    baseFilename[7] = '\0';
    baseFilename[8] = '\0';
    baseFilename[9] = '\0';
    baseFilename[10] = '\0';
    baseFilename[0xb] = '\0';
    baseFilename[0xc] = '\0';
    baseFilename[0xd] = '\0';
    baseFilename[0xe] = '\0';
    baseFilename[0xf] = '\0';
    baseFilename[0x60] = '\0';
    baseFilename[0x61] = '\0';
    baseFilename[0x62] = '\0';
    baseFilename[99] = '\0';
    std::__cxx11::string::string((string *)&local_b8,file,&local_b9);
    utils::File::buildBaseFilename(&local_b8,baseFilename,100,"/");
    std::__cxx11::string::~string((string *)&local_b8);
    p_Var3 = &(this->m_modules)._M_h._M_before_begin;
    do {
      p_Var3 = p_Var3->_M_nxt;
      if (p_Var3 == (__node_base *)0x0) {
        return (bool)(((byte)*this->m_pFlags & 2) >> 1);
      }
      bVar2 = utils::Str::wildCardMatch(baseFilename,(char *)p_Var3[1]._M_nxt);
    } while (!bVar2);
    uVar1 = *(ushort *)&p_Var3[5]._M_nxt;
  }
  return vlevel <= uVar1;
}

Assistant:

bool VRegistry::allowed(base::type::VerboseLevel vlevel, const char* file) {
  base::threading::ScopedLock scopedLock(lock());
  if (m_modules.empty() || file == nullptr) {
    return vlevel <= m_level;
  } else {
    char baseFilename[base::consts::kSourceFilenameMaxLength] = "";
    base::utils::File::buildBaseFilename(file, baseFilename);
    std::unordered_map<std::string, base::type::VerboseLevel>::iterator it = m_modules.begin();
    for (; it != m_modules.end(); ++it) {
      if (base::utils::Str::wildCardMatch(baseFilename, it->first.c_str())) {
        return vlevel <= it->second;
      }
    }
    if (base::utils::hasFlag(LoggingFlag::AllowVerboseIfModuleNotSpecified, *m_pFlags)) {
      return true;
    }
    return false;
  }
}